

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShaderDrawCallWithFSAndGS::iterate(GeometryShaderDrawCallWithFSAndGS *this)

{
  GLuint *pGVar1;
  ostringstream *this_00;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  char *description;
  byte bVar6;
  GLint link_status;
  char *code_gs_specialized_raw;
  char *code_fs_specialized_raw;
  string code_gs_specialized;
  string code_fs_specialized;
  undefined1 local_1b0 [384];
  long lVar5;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0x4f4);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pGVar1 = &this->m_vao_id;
  (**(code **)(lVar5 + 0x708))(1,pGVar1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGenVertexArrays() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x4f9);
  (**(code **)(lVar5 + 0xd8))(this->m_vao_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindVertexArray() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x4fc);
  TestCaseBase::specializeShader_abi_cxx11_
            (&code_fs_specialized,&this->super_TestCaseBase,1,&dummy_fs_code);
  code_fs_specialized_raw = code_fs_specialized._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (&code_gs_specialized,&this->super_TestCaseBase,1,&dummy_gs_code);
  code_gs_specialized_raw = code_gs_specialized._M_dataplus._M_p;
  link_status = 0;
  GVar4 = (**(code **)(lVar5 + 0x3f8))(0x8b30,1,&code_fs_specialized_raw);
  this->m_fs_po_id = GVar4;
  GVar4 = (**(code **)(lVar5 + 0x3f8))(0x8dd9,1,&code_gs_specialized_raw);
  this->m_gs_po_id = GVar4;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glCreateShaderProgramv() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x50c);
  (**(code **)(lVar5 + 0x9d8))(this->m_fs_po_id,0x8b82,&link_status);
  if (link_status == 1) {
    (**(code **)(lVar5 + 0x9d8))(this->m_gs_po_id,0x8b82,&link_status);
    if (link_status == 1) {
      (**(code **)(lVar5 + 0x6d8))(1,&this->m_pipeline_object_id);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glGenProgramPipelines() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0x526);
      (**(code **)(lVar5 + 0x1688))(this->m_pipeline_object_id,2,this->m_fs_po_id);
      (**(code **)(lVar5 + 0x1688))(this->m_pipeline_object_id,4,this->m_gs_po_id);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glUseProgramStages() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0x52a);
      (**(code **)(lVar5 + 0x98))(this->m_pipeline_object_id);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glBindProgramPipeline() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0x52d);
      (**(code **)(lVar5 + 0x538))(0,0,1);
      iVar2 = (**(code **)(lVar5 + 0x800))();
      bVar6 = 1;
      if (iVar2 == 0x502) goto LAB_00ccf992;
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"Invalid draw call generated an error code [");
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00,
                      "] which is different from the expected GL_INVALID_OPERATION.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),"Dummy geometry shader program failed to link.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),"Dummy fragment shader program failed to link.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  bVar6 = 0;
LAB_00ccf992:
  if (this->m_pipeline_object_id != 0) {
    (**(code **)(lVar5 + 0x450))(1,&this->m_pipeline_object_id);
    this->m_pipeline_object_id = 0;
  }
  if (this->m_gs_po_id != 0) {
    (**(code **)(lVar5 + 0x448))();
    this->m_gs_po_id = 0;
  }
  if (this->m_fs_po_id != 0) {
    (**(code **)(lVar5 + 0x448))();
    this->m_fs_po_id = 0;
  }
  if (*pGVar1 != 0) {
    (**(code **)(lVar5 + 0x490))(1,pGVar1);
    *pGVar1 = 0;
  }
  description = "Fail";
  if (bVar6 != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar6 ^ 1),
             description);
  std::__cxx11::string::~string((string *)&code_gs_specialized);
  std::__cxx11::string::~string((string *)&code_fs_specialized);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderDrawCallWithFSAndGS::iterate()
{
	glw::GLenum			  error_code = GL_NO_ERROR;
	const glw::Functions& gl		 = m_context.getRenderContext().getFunctions();
	bool				  result	 = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Create & bind a VAO */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

	/* Create shader program objects */
	std::string code_fs_specialized = specializeShader(1, /* parts */
													   &dummy_fs_code);
	const char* code_fs_specialized_raw = code_fs_specialized.c_str();
	std::string code_gs_specialized		= specializeShader(1, /* parts */
													   &dummy_gs_code);
	const char* code_gs_specialized_raw = code_gs_specialized.c_str();
	glw::GLint  link_status				= GL_FALSE;

	m_fs_po_id = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, /* count */
										 &code_fs_specialized_raw);
	m_gs_po_id = gl.createShaderProgramv(GL_GEOMETRY_SHADER, 1, /* count */
										 &code_gs_specialized_raw);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShaderProgramv() call(s) failed.");

	gl.getProgramiv(m_fs_po_id, GL_LINK_STATUS, &link_status);

	if (link_status != GL_TRUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Dummy fragment shader program failed to link."
						   << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	gl.getProgramiv(m_gs_po_id, GL_LINK_STATUS, &link_status);

	if (link_status != GL_TRUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Dummy geometry shader program failed to link."
						   << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Create & set up a pipeline object */
	gl.genProgramPipelines(1, &m_pipeline_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenProgramPipelines() call failed.");

	gl.useProgramStages(m_pipeline_object_id, GL_FRAGMENT_SHADER_BIT, m_fs_po_id);
	gl.useProgramStages(m_pipeline_object_id, GL_GEOMETRY_SHADER_BIT, m_gs_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call(s) failed.");

	gl.bindProgramPipeline(m_pipeline_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call failed.");

	/* Try to do a draw call */
	gl.drawArrays(GL_POINTS, 0, /* first */
				  1);			/* count */

	error_code = gl.getError();
	if (error_code != GL_INVALID_OPERATION)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid draw call generated an error code [" << error_code
						   << "]"
							  " which is different from the expected GL_INVALID_OPERATION."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

end:
	// m_pipeline_object_id is generated in this function, need to be freed
	if (m_pipeline_object_id)
	{
		gl.deleteProgramPipelines(1, &m_pipeline_object_id);
		m_pipeline_object_id = 0;
	}

	// m_gs_po_id is generated in this function, need to be freed
	if (m_gs_po_id)
	{
		gl.deleteProgram(m_gs_po_id);
		m_gs_po_id = 0;
	}

	// m_fs_po_id is generated in this function, need to be freed
	if (m_fs_po_id)
	{
		gl.deleteProgram(m_fs_po_id);
		m_fs_po_id = 0;
	}

	// m_vao_id is generated in this function, need to be freed
	if (m_vao_id)
	{
		gl.deleteVertexArrays(1, &m_vao_id);
		m_vao_id = 0;
	}

	/* All done */
	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}